

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O0

void api_fixed_suite::fixed_ctor_copy(void)

{
  bool bVar1;
  undefined4 local_9c;
  size_type local_98;
  undefined4 local_8c;
  size_type local_88 [2];
  undefined1 auStack_78 [8];
  circular_view<int,_4UL> clone;
  undefined4 local_54;
  size_type local_50;
  undefined4 local_44;
  size_type local_40 [2];
  undefined1 auStack_30 [8];
  circular_view<int,_4UL> span;
  int array [4];
  
  span.member.next = 0;
  vista::circular_view<int,_4UL>::circular_view<4UL,_0>
            ((circular_view<int,_4UL> *)auStack_30,(value_type (*) [4])&span.member.next);
  bVar1 = vista::circular_view<int,_4UL>::empty((circular_view<int,_4UL> *)auStack_30);
  boost::detail::test_impl
            ("span.empty()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x2a0,"void api_fixed_suite::fixed_ctor_copy()",bVar1);
  bVar1 = vista::circular_view<int,_4UL>::full((circular_view<int,_4UL> *)auStack_30);
  boost::detail::test_impl
            ("!span.full()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x2a1,"void api_fixed_suite::fixed_ctor_copy()",!bVar1);
  local_40[0] = vista::circular_view<int,_4UL>::size((circular_view<int,_4UL> *)auStack_30);
  local_44 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x2a2,"void api_fixed_suite::fixed_ctor_copy()",local_40,&local_44);
  local_50 = vista::circular_view<int,_4UL>::capacity((circular_view<int,_4UL> *)auStack_30);
  local_54 = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.capacity()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x2a3,"void api_fixed_suite::fixed_ctor_copy()",&local_50,&local_54);
  clone.member.size = span.member.size;
  auStack_78 = auStack_30;
  clone.member.data = span.member.data;
  bVar1 = vista::circular_view<int,_4UL>::empty((circular_view<int,_4UL> *)auStack_78);
  boost::detail::test_impl
            ("clone.empty()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x2a5,"void api_fixed_suite::fixed_ctor_copy()",bVar1);
  bVar1 = vista::circular_view<int,_4UL>::full((circular_view<int,_4UL> *)auStack_78);
  boost::detail::test_impl
            ("!clone.full()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x2a6,"void api_fixed_suite::fixed_ctor_copy()",(bool)(bVar1 - 1U & 1));
  local_88[0] = vista::circular_view<int,_4UL>::size((circular_view<int,_4UL> *)auStack_78);
  local_8c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("clone.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x2a7,"void api_fixed_suite::fixed_ctor_copy()",local_88,&local_8c);
  local_98 = vista::circular_view<int,_4UL>::capacity((circular_view<int,_4UL> *)auStack_78);
  local_9c = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("clone.capacity()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x2a8,"void api_fixed_suite::fixed_ctor_copy()",&local_98,&local_9c);
  return;
}

Assistant:

void fixed_ctor_copy()
{
    int array[4] = {};
    circular_view<int, 4> span(array);
    BOOST_TEST(span.empty());
    BOOST_TEST(!span.full());
    BOOST_TEST_EQ(span.size(), 0);
    BOOST_TEST_EQ(span.capacity(), 4);
    circular_view<int, 4> clone(span);
    BOOST_TEST(clone.empty());
    BOOST_TEST(!clone.full());
    BOOST_TEST_EQ(clone.size(), 0);
    BOOST_TEST_EQ(clone.capacity(), 4);
}